

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O1

ion_status_t sl_insert(ion_skiplist_t *skiplist,ion_key_t key,ion_value_t value)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  ion_sl_level_t iVar4;
  sl_node *__ptr;
  void *__ptr_00;
  void *__dest;
  sl_node *psVar5;
  sl_node **ppsVar6;
  ion_status_t iVar7;
  size_t __size;
  ion_sl_node_t *piVar12;
  sl_node ***pppsVar13;
  long lVar14;
  ion_status_t iVar8;
  ion_status_t iVar9;
  ion_status_t iVar10;
  ion_status_t iVar11;
  
  iVar1 = (skiplist->super).record.key_size;
  __size = (size_t)(skiplist->super).record.value_size;
  __ptr = (sl_node *)malloc(0x20);
  if (__ptr == (sl_node *)0x0) {
    iVar11.error = '\x06';
    iVar11._1_3_ = 0;
    iVar11.count = 0;
    return iVar11;
  }
  __ptr_00 = malloc((long)iVar1);
  __ptr->key = __ptr_00;
  if (__ptr_00 != (void *)0x0) {
    __dest = malloc(__size);
    __ptr->value = __dest;
    if (__dest == (void *)0x0) {
      free(__ptr_00);
      free(__ptr);
      iVar8.error = '\x06';
      iVar8._1_3_ = 0;
      iVar8.count = 0;
      return iVar8;
    }
    memcpy(__ptr_00,key,(long)iVar1);
    memcpy(__dest,value,__size);
    psVar5 = sl_find_node(skiplist,key);
    if ((psVar5->key == (ion_key_t)0x0) ||
       (cVar3 = (*(skiplist->super).compare)(psVar5->key,key,iVar1), cVar3 != '\0')) {
      iVar4 = sl_gen_level(skiplist);
      __ptr->height = iVar4;
      ppsVar6 = (sl_node **)malloc((long)iVar4 * 8 + 8);
      __ptr->next = ppsVar6;
      if (ppsVar6 != (sl_node **)0x0) {
        piVar12 = skiplist->head;
        lVar14 = (long)piVar12->height;
        if (-1 < (long)piVar12->height) {
          do {
            while( true ) {
              pppsVar13 = &piVar12->next;
              if ((piVar12->next[lVar14] == (sl_node *)0x0) ||
                 (cVar3 = (*(skiplist->super).compare)(key,piVar12->next[lVar14]->key,iVar1),
                 cVar3 < '\0')) break;
              piVar12 = (*pppsVar13)[lVar14];
            }
            if (lVar14 <= __ptr->height) {
              __ptr->next[lVar14] = (*pppsVar13)[lVar14];
              (*pppsVar13)[lVar14] = __ptr;
            }
            bVar2 = 0 < lVar14;
            lVar14 = lVar14 + -1;
          } while (bVar2);
        }
        iVar10.error = '\0';
        iVar10._1_3_ = 0;
        iVar10.count = 1;
        return iVar10;
      }
    }
    else {
      __ptr->height = 0;
      ppsVar6 = (sl_node **)malloc(8);
      __ptr->next = ppsVar6;
      if (ppsVar6 != (sl_node **)0x0) {
        ppsVar6 = psVar5->next;
        while( true ) {
          pppsVar13 = &psVar5->next;
          if ((*ppsVar6 == (sl_node *)0x0) ||
             (cVar3 = (*(skiplist->super).compare)((*ppsVar6)->key,key,iVar1), cVar3 != '\0'))
          break;
          psVar5 = **pppsVar13;
          ppsVar6 = psVar5->next;
        }
        *__ptr->next = **pppsVar13;
        **pppsVar13 = __ptr;
        iVar9.error = '\0';
        iVar9._1_3_ = 0;
        iVar9.count = 1;
        return iVar9;
      }
    }
    free(__ptr->value);
    free(__ptr->key);
  }
  free(__ptr);
  iVar7.error = '\x06';
  iVar7._1_3_ = 0;
  iVar7.count = 0;
  return iVar7;
}

Assistant:

ion_status_t
sl_insert(
	ion_skiplist_t	*skiplist,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_key_size_t		key_size	= skiplist->super.record.key_size;
	ion_value_size_t	value_size	= skiplist->super.record.value_size;

	ion_sl_node_t *newnode			= malloc(sizeof(ion_sl_node_t));

	if (NULL == newnode) {
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	newnode->key = malloc((size_t) key_size);

	if (NULL == newnode->key) {
		free(newnode);
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	newnode->value = malloc((size_t) value_size);

	if (NULL == newnode->value) {
		free(newnode->key);
		free(newnode);
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	memcpy(newnode->key, key, key_size);
	memcpy(newnode->value, value, value_size);

	/* First we check if there's already a duplicate node. If there is, we're
	   going to do a modified insert instead. */
	ion_sl_node_t *duplicate = sl_find_node(skiplist, key);

	if ((NULL != duplicate->key) && (skiplist->super.compare(duplicate->key, key, key_size) == 0)) {
		/* Child duplicate nodes have no height (which is effectively 1). */
		newnode->height = 0;
		newnode->next	= malloc(sizeof(ion_sl_node_t *) * (newnode->height + 1));

		if (NULL == newnode->next) {
			free(newnode->value);
			free(newnode->key);
			free(newnode);
			return ION_STATUS_ERROR(err_out_of_memory);
		}

		/* We want duplicate to be the last node in the block of duplicate
		 * nodes, so we traverse along the bottom until we get there.
		*/
		while (NULL != duplicate->next[0] && skiplist->super.compare(duplicate->next[0]->key, key, key_size) == 0) {
			duplicate = duplicate->next[0];
		}

		/* Only one height to worry about */
		newnode->next[0]	= duplicate->next[0];
		duplicate->next[0]	= newnode;
	}
	else {
		/* If there's no duplicate node, we do a vanilla insert instead */
		newnode->height = sl_gen_level(skiplist);
		newnode->next	= malloc(sizeof(ion_sl_node_t *) * (newnode->height + 1));

		if (NULL == newnode->next) {
			free(newnode->value);
			free(newnode->key);
			free(newnode);
			return ION_STATUS_ERROR(err_out_of_memory);
		}

		ion_sl_node_t	*cursor = skiplist->head;
		ion_sl_level_t	h;

		for (h = skiplist->head->height; h >= 0; --h) {
			/* The memcmp will return -1 if key is smaller, 0 if equal, 1 if greater. */
			while (NULL != cursor->next[h] && skiplist->super.compare(key, cursor->next[h]->key, key_size) >= 0) {
				cursor = cursor->next[h];
			}

			if (h <= newnode->height) {
				newnode->next[h]	= cursor->next[h];
				cursor->next[h]		= newnode;
			}
		}
	}

	return ION_STATUS_OK(1);
}